

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O1

int parse_images_dir(char *base_path,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *file_path)

{
  int iVar1;
  DIR *__dirp;
  dirent *pdVar2;
  undefined8 extraout_RAX;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  __dirp = opendir(base_path);
  if (__dirp != (DIR *)0x0) {
    pdVar2 = readdir(__dirp);
    if (pdVar2 != (dirent *)0x0) {
      do {
        iVar1 = strcmp(pdVar2->d_name,".");
        if (iVar1 != 0) {
          iVar1 = strcmp(pdVar2->d_name,"..");
          if (iVar1 != 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_50,base_path,(allocator<char> *)&local_70);
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,local_50,local_48 + (long)local_50);
            std::__cxx11::string::append((char *)&local_70);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       file_path,&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            if (local_50 != local_40) {
              operator_delete(local_50,local_40[0] + 1);
            }
          }
        }
        pdVar2 = readdir(__dirp);
      } while (pdVar2 != (dirent *)0x0);
    }
    closedir(__dirp);
    return 0;
  }
  parse_images_dir();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int parse_images_dir(const char *base_path, std::vector<std::string>& file_path)
{
    DIR *dir;
    struct dirent *ptr;

    if ((dir=opendir(base_path)) == NULL)
    {
        perror("Open dir error...");
        exit(1);
    }

    while ((ptr=readdir(dir)) != NULL)
    {
        if(strcmp(ptr->d_name,".")==0 || strcmp(ptr->d_name,"..")==0)    ///current dir OR parrent dir
        {
            continue;
        } 

        std::string path = base_path;
        file_path.push_back(path + ptr->d_name);
    }
    closedir(dir);

    return 0;
}